

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crange.h
# Opt level: O0

complex<double> CRange::hyperg<double>(complex<double> *a,complex<double> *b,complex<double> *z)

{
  undefined8 extraout_RAX;
  undefined7 uVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  undefined8 extraout_XMM0_Qa;
  double dVar3;
  complex<double> cVar4;
  bool local_c9;
  complex<double> local_c8;
  complex<double> local_b8;
  complex<double> local_a8;
  complex<double> local_98;
  complex<double> local_88 [2];
  undefined1 local_68 [8];
  complex<double> Cm;
  complex<double> previousterm;
  complex<double> term;
  double dm;
  complex<double> *z_local;
  complex<double> *b_local;
  complex<double> *a_local;
  complex<double> sumterm;
  
  term._M_value._8_8_ = 0;
  std::complex<double>::complex((complex<double> *)(previousterm._M_value + 8),1.0,0.0);
  std::complex<double>::complex((complex<double> *)&a_local,1.0,0.0);
  std::complex<double>::complex((complex<double> *)(Cm._M_value + 8),0.0,0.0);
  do {
    Cm._M_value._8_8_ = previousterm._M_value._8_8_;
    previousterm._M_value._0_8_ = term._M_value._0_8_;
    term._M_value._8_8_ = (double)term._M_value._8_8_ + 1.0;
    uVar2 = 0;
    std::complex<double>::complex((complex<double> *)local_68,(double)term._M_value._8_8_ - 1.0,0.0)
    ;
    std::operator+(a,(complex<double> *)local_68);
    local_a8._M_value._8_8_ = uVar2;
    std::operator+(b,(complex<double> *)local_68);
    local_b8._M_value._8_8_ = uVar2;
    std::operator/(&local_a8,&local_b8);
    local_98._M_value._8_8_ = uVar2;
    std::operator*((complex<double> *)(Cm._M_value + 8),&local_98);
    local_88[0]._M_value._8_8_ = uVar2;
    std::operator/(z,(double *)(term._M_value + 8));
    local_c8._M_value._8_8_ = uVar2;
    std::operator*(local_88,&local_c8);
    local_88[1]._M_value._8_8_ = uVar2;
    previousterm._M_value._8_8_ = extraout_XMM0_Qa;
    term._M_value._0_8_ = uVar2;
    std::complex<double>::operator+=
              ((complex<double> *)&a_local,(complex<double> *)(previousterm._M_value + 8));
    dVar3 = std::abs<double>((complex<double> *)(previousterm._M_value + 8));
    uVar1 = 0;
    local_c9 = false;
    uVar2 = extraout_RDX;
    if (1e-06 < dVar3) {
      dVar3 = std::abs<double>((complex<double> *)(Cm._M_value + 8));
      local_c9 = 1e-06 < dVar3;
      uVar1 = (undefined7)((ulong)extraout_RAX >> 8);
      uVar2 = extraout_RDX_00;
    }
    cVar4._M_value._1_7_ = uVar1;
    cVar4._M_value[0] = local_c9;
  } while (local_c9 != false);
  cVar4._M_value._8_8_ = uVar2;
  return (complex<double>)cVar4._M_value;
}

Assistant:

std::complex<T> hyperg(const std::complex<T> &a,
                                                const std::complex<T> &b,
                                                const std::complex<T> &z)
    {
        T dm = 0.0;
        std::complex<T> term(1.0, 0.0);
        std::complex<T> sumterm(1.0, 0.0);
        std::complex<T> previousterm;
        do {
            previousterm = term;
            dm += 1.0;
            std::complex<T> Cm(dm-1.0, 0.0);
            term = previousterm * ((a + Cm)/(b + Cm)) * (z/dm);
            sumterm += term;
        } while( std::abs(term) > 1.0e-6 && std::abs(previousterm) > 1.0e-6 );
        return(sumterm);
    }